

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>::
~AttachmentPromiseNode
          (AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>
           *this)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  char *pcVar4;
  PromiseArenaMember *node;
  
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  pAVar1 = (this->attachment).impl.
           super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value.ptr;
  if (pAVar1 != (ArrayPtr<const_unsigned_char> *)0x0) {
    sVar2 = (this->attachment).impl.
            super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value.size_;
    (this->attachment).impl.super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.
    value.ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    (this->attachment).impl.super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.
    value.size_ = 0;
    pAVar3 = (this->attachment).impl.
             super_TupleElement<1U,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>.value.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pAVar1,0x10,sVar2,sVar2,0);
  }
  pcVar4 = (this->attachment).impl.super_TupleElement<0U,_kj::String>.value.content.ptr;
  if (pcVar4 != (char *)0x0) {
    sVar2 = (this->attachment).impl.super_TupleElement<0U,_kj::String>.value.content.size_;
    (this->attachment).impl.super_TupleElement<0U,_kj::String>.value.content.ptr = (char *)0x0;
    (this->attachment).impl.super_TupleElement<0U,_kj::String>.value.content.size_ = 0;
    pAVar3 = (this->attachment).impl.super_TupleElement<0U,_kj::String>.value.content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar4,1,sVar2,sVar2,0);
  }
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR___cxa_pure_virtual_006dcea8;
  node = &((this->super_AttachmentPromiseNodeBase).dependency.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->super_AttachmentPromiseNodeBase).dependency.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

~AttachmentPromiseNode() noexcept(false) {
    // We need to make sure the dependency is deleted before we delete the attachment because the
    // dependency may be using the attachment.
    dropDependency();
  }